

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

void mxx::gatherv<mypair<unsigned_long>>
               (mypair<unsigned_long> *data,size_t size,mypair<unsigned_long> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> counts;
  datatype dt_1;
  size_t total_size;
  vector<int,_std::allocator<int>_> displs;
  datatype mpi_sizet;
  
  puVar3 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  total_size = 0;
  if (puVar3 != puVar1) {
    do {
      uVar2 = (int)total_size + (int)*puVar3;
      total_size = (size_t)uVar2;
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
    total_size = (size_t)(int)uVar2;
  }
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_00150928;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  MPI_Bcast(&total_size,1,&ompi_mpi_unsigned_long,root,comm->mpi_comm);
  if (total_size < 0x7fffffff) {
    dt_1.mpitype = datatype_contiguous<unsigned_long,_2UL>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00150928;
    dt_1.builtin = false;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&counts,(long)comm->m_size,(allocator_type *)&displs);
      puVar3 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
      if (0 < lVar4) {
        uVar5 = lVar4 + 1;
        lVar4 = 0;
        do {
          *(undefined4 *)
           ((long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar4) =
               *(undefined4 *)((long)puVar3 + lVar4 * 2);
          uVar5 = uVar5 - 1;
          lVar4 = lVar4 + 4;
        } while (1 < uVar5);
      }
      impl::get_displacements<int>(&displs,&counts);
      MPI_Gatherv(data,size & 0xffffffff,dt_1.mpitype,out,
                  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,dt_1.mpitype,root,comm->mpi_comm);
      if (displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      MPI_Gatherv(data,size & 0xffffffff,dt_1.mpitype,0,0,0,dt_1.mpitype,root,comm->mpi_comm);
    }
    datatype::~datatype(&dt_1);
  }
  else {
    impl::gatherv_big<mypair<unsigned_long>>(data,size,out,recv_sizes,root,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void gatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    // tell everybody about the total size
    MPI_Bcast(&total_size, 1, mpi_sizet.type(), root, comm);
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::gatherv_big(data, size, out, recv_sizes, root, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        if (comm.rank() == root) {
            std::vector<int> counts(comm.size());
            std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
            std::vector<int> displs = impl::get_displacements(counts);
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        out, &counts[0], &displs[0], dt.type(), root, comm);
        } else {
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        NULL, NULL, NULL, dt.type(), root, comm);
        }
    }
}